

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_sBIT(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  byte local_29 [4];
  byte local_25;
  undefined1 auStack_24 [3];
  png_byte buf [4];
  png_byte sample_depth;
  uint i;
  uint truelen;
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 6) == 0) {
    if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 2) == 0)) {
      if (png_ptr->color_type == '\x03') {
        stack0xffffffffffffffe0 = 3;
        local_25 = 8;
      }
      else {
        register0x00000000 = (uint)png_ptr->channels;
        local_25 = png_ptr->bit_depth;
      }
      if ((length == stack0xffffffffffffffe0) && (length < 5)) {
        local_29[3] = local_25;
        local_29[2] = local_25;
        local_29[1] = local_25;
        local_29[0] = local_25;
        png_crc_read(png_ptr,local_29,stack0xffffffffffffffe0);
        iVar1 = png_crc_finish(png_ptr,0);
        if (iVar1 == 0) {
          for (_auStack_24 = 0; _auStack_24 < stack0xffffffffffffffe0; _auStack_24 = _auStack_24 + 1
              ) {
            if ((local_29[_auStack_24] == 0) || (local_25 < local_29[_auStack_24])) {
              png_chunk_benign_error(png_ptr,"invalid");
              return;
            }
          }
          if ((png_ptr->color_type & 2) == 0) {
            (png_ptr->sig_bit).gray = local_29[0];
            (png_ptr->sig_bit).red = local_29[0];
            (png_ptr->sig_bit).green = local_29[0];
            (png_ptr->sig_bit).blue = local_29[0];
            (png_ptr->sig_bit).alpha = local_29[1];
          }
          else {
            (png_ptr->sig_bit).red = local_29[0];
            (png_ptr->sig_bit).green = local_29[1];
            (png_ptr->sig_bit).blue = local_29[2];
            (png_ptr->sig_bit).alpha = local_29[3];
          }
          png_set_sBIT(png_ptr,info_ptr,&png_ptr->sig_bit);
        }
      }
      else {
        png_chunk_benign_error(png_ptr,"invalid");
        png_crc_finish(png_ptr,length);
      }
    }
    else {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"duplicate");
    }
  }
  else {
    png_crc_finish(png_ptr,length);
    png_chunk_benign_error(png_ptr,"out of place");
  }
  return;
}

Assistant:

void /* PRIVATE */
png_handle_sBIT(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   unsigned int truelen, i;
   png_byte sample_depth;
   png_byte buf[4];

   png_debug(1, "in png_handle_sBIT");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & (PNG_HAVE_IDAT|PNG_HAVE_PLTE)) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_sBIT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
   {
      truelen = 3;
      sample_depth = 8;
   }

   else
   {
      truelen = png_ptr->channels;
      sample_depth = png_ptr->bit_depth;
   }

   if (length != truelen || length > 4)
   {
      png_chunk_benign_error(png_ptr, "invalid");
      png_crc_finish(png_ptr, length);
      return;
   }

   buf[0] = buf[1] = buf[2] = buf[3] = sample_depth;
   png_crc_read(png_ptr, buf, truelen);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   for (i=0; i<truelen; ++i)
   {
      if (buf[i] == 0 || buf[i] > sample_depth)
      {
         png_chunk_benign_error(png_ptr, "invalid");
         return;
      }
   }

   if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) != 0)
   {
      png_ptr->sig_bit.red = buf[0];
      png_ptr->sig_bit.green = buf[1];
      png_ptr->sig_bit.blue = buf[2];
      png_ptr->sig_bit.alpha = buf[3];
   }

   else
   {
      png_ptr->sig_bit.gray = buf[0];
      png_ptr->sig_bit.red = buf[0];
      png_ptr->sig_bit.green = buf[0];
      png_ptr->sig_bit.blue = buf[0];
      png_ptr->sig_bit.alpha = buf[1];
   }

   png_set_sBIT(png_ptr, info_ptr, &(png_ptr->sig_bit));
}